

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O0

void AnalysisRemoteData(serial_frame_t *pFrame)

{
  serial_frame_t *pFrame_local;
  
  RemoteData.Joystick_LX = (int)(char)*pFrame->pdata;
  RemoteData.Joystick_LY = (int)(char)pFrame->pdata[1];
  RemoteData.Joystick_RX = (int)(char)pFrame->pdata[2];
  RemoteData.Joystick_RY = (int)(char)pFrame->pdata[3];
  RemoteData.Gait = (uint)pFrame->pdata[4];
  RemoteData.Coordinate = (uint)pFrame->pdata[5];
  RemoteData.Dial = pFrame->pdata[6];
  return;
}

Assistant:

void AnalysisRemoteData(serial_frame_t *pFrame)
{
	RemoteData.Joystick_LX = (int8_t)pFrame->pdata[0];
	RemoteData.Joystick_LY = (int8_t)pFrame->pdata[1];
	RemoteData.Joystick_RX = (int8_t)pFrame->pdata[2];
	RemoteData.Joystick_RY = (int8_t)pFrame->pdata[3];
	RemoteData.Gait = pFrame->pdata[4];
	RemoteData.Coordinate = pFrame->pdata[5];
	RemoteData.Dial = pFrame->pdata[6];
}